

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init_gau.c
# Opt level: O0

int init_gau(lexicon_t *lex,model_def_t *mdef,feat_t *feat)

{
  uint32 n_phone_00;
  uint32 *seg_00;
  int32 n_frame_00;
  vector_t *acmod_set_00;
  int iVar1;
  cmd_ln_t *pcVar2;
  long lVar3;
  long lVar4;
  char *pcVar5;
  acmod_id_t *phone_00;
  size_t sVar6;
  acmod_set_t *__s;
  uint32 local_234;
  uint32 local_20c;
  uint32 local_1d4;
  uint32 local_1ac;
  uint32 local_184;
  int local_144;
  uint32 local_138;
  uint32 local_130;
  uint local_128;
  uint32 local_120;
  uint local_118;
  uint32 *local_110;
  uint32 *local_108;
  int32 var_is_full;
  uint32 ceplen;
  char *meanfn;
  mfcc_t ***f;
  uint32 local_e0;
  uint32 r_n_density;
  uint32 r_n_feat;
  uint32 r_n_ts;
  uint32 *r_veclen;
  uint32 *puStack_c8;
  uint32 n_ts;
  uint32 *veclen;
  float32 ***dnom;
  vector_t ****fullvar_acc;
  vector_t ***var_acc;
  vector_t ***mean;
  vector_t ***mean_acc;
  char *btw_mark;
  acmod_id_t *paStack_88;
  uint32 n_phone;
  acmod_id_t *phone;
  char **ppcStack_78;
  uint32 n_word;
  char **word;
  uint32 *puStack_68;
  uint32 tick_cnt;
  uint32 *ci_sseq;
  uint32 *sseq;
  uint16 *seg;
  int local_48;
  int32 tmp;
  int32 feat_n_frame;
  int32 n_frame;
  vector_t *mfcc;
  acmod_set_t *acmod_set;
  char *fn;
  char *trans;
  feat_t *feat_local;
  model_def_t *mdef_local;
  lexicon_t *lex_local;
  
  fn = (char *)0x0;
  _feat_n_frame = (mfcc_t **)0x0;
  sseq = (uint32 *)0x0;
  ci_sseq = (uint32 *)0x0;
  puStack_68 = (uint32 *)0x0;
  word._4_4_ = 0;
  ppcStack_78 = (char **)0x0;
  paStack_88 = (acmod_id_t *)0x0;
  mean_acc = (vector_t ***)0x0;
  mean = (vector_t ***)0x0;
  var_acc = (vector_t ***)0x0;
  fullvar_acc = (vector_t ****)0x0;
  dnom = (float32 ***)0x0;
  veclen = (uint32 *)0x0;
  meanfn = (char *)0x0;
  trans = (char *)feat;
  feat_local = (feat_t *)mdef;
  mdef_local = (model_def_t *)lex;
  pcVar2 = cmd_ln_get();
  lVar3 = cmd_ln_int_r(pcVar2,"-ceplen");
  pcVar2 = cmd_ln_get();
  lVar4 = cmd_ln_int_r(pcVar2,"-fullvar");
  if (feat_local == (feat_t *)0x0) {
    mfcc = (vector_t *)0x0;
    r_veclen._4_4_ = 1;
  }
  else {
    mfcc = *(vector_t **)feat_local;
    r_veclen._4_4_ = *(uint *)((long)&feat_local->stream_len + 4);
  }
  pcVar2 = cmd_ln_get();
  pcVar5 = cmd_ln_str_r(pcVar2,"-meanfn");
  if (*(long *)(trans + 0x80) == 0) {
    if (*(long *)(trans + 0x28) == 0) {
      local_110 = *(uint32 **)(trans + 0x18);
    }
    else {
      local_110 = *(uint32 **)(trans + 0x28);
    }
    local_108 = local_110;
  }
  else {
    local_108 = (uint32 *)(trans + 0x8c);
  }
  puStack_c8 = local_108;
  if (pcVar5 == (char *)0x0) {
    if (*(int *)(trans + 0x24) == 0) {
      local_118 = *(uint *)(trans + 0x14);
    }
    else {
      local_118 = *(uint *)(trans + 0x24);
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
            ,0x86,"Computing %ux%ux1 mean estimates\n",(ulong)r_veclen._4_4_,(ulong)local_118);
    if (*(int *)(trans + 0x24) == 0) {
      local_120 = *(uint32 *)(trans + 0x14);
    }
    else {
      local_120 = *(uint32 *)(trans + 0x24);
    }
    mean = gauden_alloc_param(r_veclen._4_4_,local_120,1,puStack_c8);
    fullvar_acc = (vector_t ****)0x0;
  }
  else {
    if (pcVar5 == (char *)0x0) {
      __assert_fail("meanfn != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                    ,0x8f,"int init_gau(lexicon_t *, model_def_t *, feat_t *)");
    }
    if (*(int *)(trans + 0x24) == 0) {
      local_128 = *(uint *)(trans + 0x14);
    }
    else {
      local_128 = *(uint *)(trans + 0x24);
    }
    err_msg(ERR_INFO,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
            ,0x91,"Computing %ux%ux1 variance estimates\n",(ulong)r_veclen._4_4_,(ulong)local_128);
    iVar1 = s3gau_read(pcVar5,&var_acc,&r_n_density,&local_e0,(uint32 *)((long)&f + 4),
                       (uint32 **)&r_n_feat);
    if (iVar1 != 0) {
      err_msg_system(ERR_FATAL,
                     "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                     ,0x9a,"Unable to open %s for reading\n",pcVar5);
      exit(1);
    }
    ckd_free(_r_n_feat);
    mean = (vector_t ***)0x0;
    if ((int)lVar4 == 0) {
      if (*(int *)(trans + 0x24) == 0) {
        local_138 = *(uint32 *)(trans + 0x14);
      }
      else {
        local_138 = *(uint32 *)(trans + 0x24);
      }
      fullvar_acc = (vector_t ****)gauden_alloc_param(r_veclen._4_4_,local_138,1,puStack_c8);
    }
    else {
      if (*(int *)(trans + 0x24) == 0) {
        local_130 = *(uint32 *)(trans + 0x14);
      }
      else {
        local_130 = *(uint32 *)(trans + 0x24);
      }
      dnom = (float32 ***)gauden_alloc_param_full(r_veclen._4_4_,local_130,1,puStack_c8);
    }
  }
  if (*(int *)(trans + 0x24) == 0) {
    local_144 = *(int *)(trans + 0x14);
  }
  else {
    local_144 = *(int *)(trans + 0x24);
  }
  veclen = (uint32 *)
           __ckd_calloc_3d__((ulong)r_veclen._4_4_,(long)local_144,1,4,
                             "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                             ,0xab);
LAB_00103096:
  iVar1 = corpus_next_utt();
  if (iVar1 == 0) {
    pcVar2 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar2,"-accumdir");
    sVar6 = strlen(pcVar5);
    __s = (acmod_set_t *)
          __ckd_calloc__(sVar6 + 0xf,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                         ,0x128);
    acmod_set = __s;
    pcVar2 = cmd_ln_get();
    pcVar5 = cmd_ln_str_r(pcVar2,"-accumdir");
    sprintf((char *)__s,"%s/gauden_counts",pcVar5);
    if ((int)lVar4 == 0) {
      if (*(int *)(trans + 0x24) == 0) {
        local_234 = *(uint32 *)(trans + 0x14);
      }
      else {
        local_234 = *(uint32 *)(trans + 0x24);
      }
      s3gaucnt_write((char *)acmod_set,mean,(vector_t ***)fullvar_acc,1,(float32 ***)veclen,
                     r_veclen._4_4_,local_234,1,puStack_c8);
    }
    else {
      if (*(int *)(trans + 0x24) == 0) {
        local_20c = *(uint32 *)(trans + 0x14);
      }
      else {
        local_20c = *(uint32 *)(trans + 0x24);
      }
      s3gaucnt_write_full((char *)acmod_set,mean,(vector_t ****)dnom,1,(float32 ***)veclen,
                          r_veclen._4_4_,local_20c,1,puStack_c8);
    }
    if (_feat_n_frame != (mfcc_t **)0x0) {
      free(*_feat_n_frame);
      ckd_free(_feat_n_frame);
      _feat_n_frame = (mfcc_t **)0x0;
    }
    if (fn != (char *)0x0) {
      free(fn);
      fn = (char *)0x0;
    }
    if (sseq != (uint32 *)0x0) {
      free(sseq);
      sseq = (uint32 *)0x0;
    }
    if (ppcStack_78 != (char **)0x0) {
      ckd_free(ppcStack_78);
      ppcStack_78 = (char **)0x0;
    }
    if (paStack_88 != (acmod_id_t *)0x0) {
      ckd_free(paStack_88);
      paStack_88 = (acmod_id_t *)0x0;
    }
    if (mean_acc != (vector_t ***)0x0) {
      ckd_free(mean_acc);
      mean_acc = (vector_t ***)0x0;
    }
    if (puStack_68 != (uint32 *)0x0) {
      ckd_free(puStack_68);
      puStack_68 = (uint32 *)0x0;
    }
    if (ci_sseq != (uint32 *)0x0) {
      ckd_free(ci_sseq);
      ci_sseq = (uint32 *)0x0;
    }
    if (meanfn != (char *)0x0) {
      feat_array_free((mfcc_t ***)meanfn);
    }
    if (mean != (vector_t ***)0x0) {
      gauden_free_param(mean);
    }
    if (fullvar_acc != (vector_t ****)0x0) {
      gauden_free_param((vector_t ***)fullvar_acc);
    }
    if (dnom != (float32 ***)0x0) {
      gauden_free_param_full((vector_t ****)dnom);
    }
    ckd_free_3d(veclen);
    ckd_free(acmod_set);
    return 0;
  }
  if (_feat_n_frame != (mfcc_t **)0x0) {
    free(*_feat_n_frame);
    ckd_free(_feat_n_frame);
    _feat_n_frame = (mfcc_t **)0x0;
  }
  if (fn != (char *)0x0) {
    free(fn);
    fn = (char *)0x0;
  }
  if (sseq != (uint32 *)0x0) {
    free(sseq);
    sseq = (uint32 *)0x0;
  }
  if (ppcStack_78 != (char **)0x0) {
    ckd_free(ppcStack_78);
    ppcStack_78 = (char **)0x0;
  }
  if (paStack_88 != (acmod_id_t *)0x0) {
    ckd_free(paStack_88);
    paStack_88 = (acmod_id_t *)0x0;
  }
  if (mean_acc != (vector_t ***)0x0) {
    ckd_free(mean_acc);
    mean_acc = (vector_t ***)0x0;
  }
  if (puStack_68 != (uint32 *)0x0) {
    ckd_free(puStack_68);
    puStack_68 = (uint32 *)0x0;
  }
  if (ci_sseq != (uint32 *)0x0) {
    ckd_free(ci_sseq);
    ci_sseq = (uint32 *)0x0;
  }
  if (meanfn != (char *)0x0) {
    feat_array_free((mfcc_t ***)meanfn);
    meanfn = (char *)0x0;
  }
  word._4_4_ = word._4_4_ + 1;
  if (word._4_4_ % 100 == 0) {
    printf("[%u] ",(ulong)word._4_4_);
    fflush(_stdout);
  }
  if (feat_local != (feat_t *)0x0) goto code_r0x001031dc;
  goto LAB_00103394;
code_r0x001031dc:
  iVar1 = corpus_get_sent(&fn);
  if (iVar1 != 0) {
    pcVar5 = corpus_utt_brief_name();
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
            ,0xdb,"Unable to read word transcript for %s\n",pcVar5);
    exit(1);
  }
  iVar1 = corpus_get_seg((uint16 **)&sseq,&tmp);
  if (iVar1 != 0) {
    pcVar5 = corpus_utt_brief_name();
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
            ,0xe0,"Unable to read Viterbi state segmentation for %s\n",pcVar5);
    exit(1);
  }
  phone._4_4_ = str2words(fn,(char **)0x0,0);
  ppcStack_78 = (char **)__ckd_calloc__((ulong)phone._4_4_,8,
                                        "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                                        ,0xe4);
  str2words(fn,ppcStack_78,phone._4_4_);
  phone_00 = mk_phone_list((char **)&mean_acc,(uint32 *)((long)&btw_mark + 4),ppcStack_78,
                           phone._4_4_,(lexicon_t *)mdef_local);
  acmod_set_00 = mfcc;
  n_frame_00 = tmp;
  seg_00 = sseq;
  n_phone_00 = btw_mark._4_4_;
  paStack_88 = phone_00;
  pcVar5 = corpus_utt();
  iVar1 = ck_seg((acmod_set_t *)acmod_set_00,phone_00,n_phone_00,(uint16 *)seg_00,n_frame_00,pcVar5)
  ;
  if (iVar1 == 0) {
    puStack_68 = mk_sseq((uint16 *)sseq,tmp,paStack_88,btw_mark._4_4_,(model_def_t *)feat_local);
    iVar1 = cvt2triphone((acmod_set_t *)mfcc,paStack_88,(char *)mean_acc,btw_mark._4_4_);
    if (iVar1 == 0) {
      ci_sseq = mk_sseq((uint16 *)sseq,tmp,paStack_88,btw_mark._4_4_,(model_def_t *)feat_local);
LAB_00103394:
      iVar1 = corpus_get_generic_featurevec
                        ((vector_t **)&feat_n_frame,(int32 *)((long)&seg + 4),(uint32)lVar3);
      if (iVar1 < 0) {
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                ,0xfc,"Can\'t read input features\n");
        exit(1);
      }
      if (feat_local == (feat_t *)0x0) {
        tmp = seg._4_4_;
      }
      if (seg._4_4_ != tmp) {
        pcVar5 = corpus_utt_brief_name();
        err_msg(ERR_FATAL,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                ,0x103,"# frames in MFCC file inconsistent w/ seg file for utt %s.\n",pcVar5);
        exit(1);
      }
      local_48 = tmp;
      if (tmp < 9) {
        pcVar5 = corpus_utt();
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                ,0x10a,"utt %s too short\n",pcVar5);
        if (_feat_n_frame != (mfcc_t **)0x0) {
          ckd_free(*_feat_n_frame);
          ckd_free(_feat_n_frame);
          _feat_n_frame = (mfcc_t **)0x0;
        }
      }
      else {
        meanfn = (char *)feat_array_alloc((feat_t *)trans,tmp + *(int *)(trans + 0x20));
        feat_s2mfc2feat_live((feat_t *)trans,_feat_n_frame,&local_48,1,1,(mfcc_t ***)meanfn);
        if (local_48 != tmp) {
          err_msg(ERR_FATAL,
                  "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/programs/init_gau/init_gau.c"
                  ,0x117,"# frames compute != # frames of state seg\n");
          exit(1);
        }
        if (mean == (vector_t ***)0x0) {
          if (fullvar_acc == (vector_t ****)0x0) {
            if (dnom != (float32 ***)0x0) {
              if (*(int *)(trans + 0x24) == 0) {
                local_1d4 = *(uint32 *)(trans + 0x14);
              }
              else {
                local_1d4 = *(uint32 *)(trans + 0x24);
              }
              accum_state_fullvar((vector_t ****)dnom,var_acc,(float32 ***)veclen,
                                  (vector_t **)meanfn,local_1d4,puStack_c8,ci_sseq,puStack_68,tmp);
            }
          }
          else {
            if (*(int *)(trans + 0x24) == 0) {
              local_1ac = *(uint32 *)(trans + 0x14);
            }
            else {
              local_1ac = *(uint32 *)(trans + 0x24);
            }
            accum_state_var((vector_t ***)fullvar_acc,var_acc,(float32 ***)veclen,
                            (vector_t **)meanfn,local_1ac,puStack_c8,ci_sseq,puStack_68,tmp);
          }
        }
        else {
          if (*(int *)(trans + 0x24) == 0) {
            local_184 = *(uint32 *)(trans + 0x14);
          }
          else {
            local_184 = *(uint32 *)(trans + 0x24);
          }
          accum_state_mean(mean,(float32 ***)veclen,(vector_t **)meanfn,local_184,puStack_c8,ci_sseq
                           ,puStack_68,tmp);
        }
      }
    }
  }
  goto LAB_00103096;
}

Assistant:

int
init_gau(lexicon_t *lex,
	 model_def_t *mdef,
	 feat_t *feat)
{
    char *trans = NULL;
    char *fn;
    acmod_set_t *acmod_set;

    vector_t *mfcc = NULL;
    int32 n_frame;
    int32 feat_n_frame;
    int32 tmp;
    
    uint16 *seg = NULL;
    uint32 *sseq = NULL;
    uint32 *ci_sseq = NULL;

    uint32 tick_cnt = 0;

    char **word = NULL;
    uint32 n_word;

    acmod_id_t *phone = NULL;
    uint32 n_phone;
    char *btw_mark = NULL;

    vector_t ***mean_acc = NULL;
    vector_t ***mean = NULL;
    vector_t ***var_acc = NULL;
    vector_t ****fullvar_acc = NULL;
    float32 ***dnom = NULL;

    const uint32 *veclen;

    uint32 n_ts;

    uint32 *r_veclen;
    uint32 r_n_ts;
    uint32 r_n_feat;
    uint32 r_n_density;

    mfcc_t ***f = NULL;

    const char *meanfn;

    uint32 ceplen = cmd_ln_int32("-ceplen");
    int32 var_is_full = cmd_ln_int32("-fullvar");

    if (mdef) {
	acmod_set = mdef->acmod_set;
	n_ts = mdef->n_tied_state;
    }
    else {
	acmod_set = NULL;
	n_ts = 1;		/* Global mean/var */
    }

    meanfn = cmd_ln_str("-meanfn");

    veclen = (uint32 *)feat_stream_lengths(feat);
    
    if (meanfn == NULL) {
	E_INFO("Computing %ux%ux1 mean estimates\n", n_ts, feat_dimension1(feat));
    
	mean_acc = gauden_alloc_param(n_ts,
				      feat_dimension1(feat),
				      1,
				      veclen);
	var_acc = NULL;
    }
    else {
	assert(meanfn != NULL);

	E_INFO("Computing %ux%ux1 variance estimates\n", n_ts, feat_dimension1(feat));


	if (s3gau_read(meanfn,
		       &mean,
		       &r_n_ts,
		       &r_n_feat,
		       &r_n_density,
		       &r_veclen) != S3_SUCCESS) {
	    E_FATAL_SYSTEM("Unable to open %s for reading\n", meanfn);
	}
	ckd_free(r_veclen);

	mean_acc = NULL;
	if (var_is_full)
		fullvar_acc = gauden_alloc_param_full(n_ts,
						      feat_dimension1(feat),
						      1,
						      veclen);
	else
		var_acc =  gauden_alloc_param(n_ts,
					      feat_dimension1(feat),
					      1,
					      veclen);
    }

    dnom = (float32 ***)ckd_calloc_3d(n_ts, feat_dimension1(feat), 1, sizeof(float32));

    while (corpus_next_utt()) {
	if (mfcc) {
	    free(mfcc[0]);
	    ckd_free(mfcc);
	    mfcc = NULL;
	}
	if (trans) {
	    free(trans);
	    trans = NULL;
	}
	if (seg) {
	    free(seg);
	    seg = NULL;
	}
	if (word) {
	    ckd_free(word);
	    word = NULL;
	}
	if (phone) {
	    ckd_free(phone);
	    phone = NULL;
	}
	if (btw_mark) {
	    ckd_free(btw_mark);
	    btw_mark = NULL;
	}
	if (ci_sseq) {
	    ckd_free(ci_sseq);
	    ci_sseq = NULL;
	}
	if (sseq) {
	    ckd_free(sseq);
	    sseq = NULL;
	}
	if (f) {
	    feat_array_free(f);
	    f = NULL;
	}
	
	if ((++tick_cnt % 100) == 0) {
	    printf("[%u] ", tick_cnt);
	    fflush(stdout);
	}

	if (mdef) {
	    if (corpus_get_sent(&trans) != S3_SUCCESS) {
		E_FATAL("Unable to read word transcript for %s\n", corpus_utt_brief_name());
	    }

	    if (corpus_get_seg(&seg, &n_frame) != S3_SUCCESS) {
		E_FATAL("Unable to read Viterbi state segmentation for %s\n",
			corpus_utt_brief_name());
	    }
	    
    	    n_word = str2words(trans, NULL, 0);
    	    word = ckd_calloc(n_word, sizeof(char*));
	    str2words(trans, word, n_word);
	    phone = mk_phone_list(&btw_mark, &n_phone, word, n_word, lex);

	    /* check to see whether the word transcript and dictionary entries
	       agree with the state segmentation */
	    if (ck_seg(acmod_set, phone, n_phone, seg, n_frame, corpus_utt()) != S3_SUCCESS) {
		continue;
	    }

	    /* make a tied state id sequence from the state segmentation and the
	       phone list */
	    ci_sseq = mk_sseq(seg, n_frame, phone, n_phone, mdef);

	    if (cvt2triphone(acmod_set, phone, btw_mark, n_phone) != S3_SUCCESS) {
		continue;
	    }

	    /* make a tied state id sequence from the state segmentation and the
	       phone list */
	    sseq = mk_sseq(seg, n_frame, phone, n_phone, mdef);
	}

        if (corpus_get_generic_featurevec(&mfcc, &tmp, ceplen) < 0) {
	        E_FATAL("Can't read input features\n");
	}

	if (mdef == NULL) n_frame = tmp;

	if (tmp != n_frame) {
	    E_FATAL("# frames in MFCC file inconsistent w/ seg file for utt %s.\n",
		    corpus_utt_brief_name());
	}

	feat_n_frame = n_frame;

	/* FIXME: This number is bogus, it ought to depend on the type of feature used. */
	if (n_frame < 9) {
	    E_WARN("utt %s too short\n", corpus_utt());
	    if (mfcc) {
		ckd_free(mfcc[0]);
		ckd_free(mfcc);
		mfcc = NULL;
	    }
	    continue;
	}
	
	f = feat_array_alloc(feat, feat_n_frame + feat_window_size(feat));
	feat_s2mfc2feat_live(feat, mfcc, &feat_n_frame, TRUE, TRUE, f);

	if (feat_n_frame != n_frame) {
	    E_FATAL("# frames compute != # frames of state seg\n");
	}

	if (mean_acc) {
	    /* accumulate mean sums since no estimate given */
	    accum_state_mean(mean_acc, dnom, f, feat_dimension1(feat), veclen, sseq, ci_sseq, n_frame);
	}
	else if (var_acc) {
	    /* accumulate var sums since mean estimate exists */
	    accum_state_var(var_acc, mean, dnom, f, feat_dimension1(feat), veclen, sseq, ci_sseq, n_frame);
	}
	else if (fullvar_acc) {
	    /* accumulate var sums since mean estimate exists */
	    accum_state_fullvar(fullvar_acc, mean, dnom, f, feat_dimension1(feat), veclen, sseq, ci_sseq, n_frame);
	}
    }
    
    fn = ckd_calloc(strlen(cmd_ln_str("-accumdir")) + strlen("/gauden_counts") + 1, 1);
    sprintf(fn, "%s/gauden_counts", cmd_ln_str("-accumdir"));
    
    if (var_is_full) {
	if (s3gaucnt_write_full(fn, mean_acc, fullvar_acc, TRUE /* 2-pass variance */, dnom,
				n_ts, feat_dimension1(feat), 1, veclen) != 0) {
	}
    }
    else {
	if (s3gaucnt_write(fn, mean_acc, var_acc, TRUE /* 2-pass variance */, dnom,
			   n_ts, feat_dimension1(feat), 1, veclen) != 0) {
	}
    }

    /* free the per utterance data structures from the last utt */
    if (mfcc) {
	free(mfcc[0]);
	ckd_free(mfcc);
	mfcc = NULL;
    }
    if (trans) {
	free(trans);
	trans = NULL;
    }
    if (seg) {
	free(seg);
	seg = NULL;
    }
    if (word) {
	ckd_free(word);
	word = NULL;
    }
    if (phone) {
	ckd_free(phone);
	phone = NULL;
    }
    if (btw_mark) {
	ckd_free(btw_mark);
	btw_mark = NULL;
    }
    if (ci_sseq) {
	ckd_free(ci_sseq);
	ci_sseq = NULL;
    }
    if (sseq) {
	ckd_free(sseq);
	sseq = NULL;
    }
    if (f) {
	feat_array_free(f);
	f = NULL;
    }

    if (mean_acc) {
	gauden_free_param(mean_acc);
    }
    if (var_acc) {
	gauden_free_param(var_acc);
    }
    if (fullvar_acc) {
	gauden_free_param_full(fullvar_acc);
    }
    ckd_free_3d((void ***)dnom);
    ckd_free(fn);

    return S3_SUCCESS;
}